

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp,char16_t,fmt::v8::detail::digit_grouping<char16_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,big_decimal_fp *fp,
          basic_format_specs<char16_t> *specs,float_specs fspecs,locale_ref loc)

{
  float_specs fVar1;
  bool bVar2;
  type tVar3;
  int iVar4;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> *pbVar5;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> it;
  bool local_281;
  int local_260;
  int local_25c;
  undefined1 local_239;
  int local_238;
  char16_t local_232;
  anon_class_56_7_162c6e41 local_230;
  float_specs local_1f8;
  bool local_1ed;
  int local_1ec;
  undefined1 auStack_1e8 [3];
  bool pointy;
  int num_zeros;
  char **local_1e0;
  sign_t *local_1d8;
  int *local_1d0;
  char16_t *local_1c8;
  digit_grouping<char16_t> *local_1c0;
  int *local_1b8;
  char16_t *local_1b0;
  float_specs local_1a8;
  big_decimal_fp *local_1a0;
  undefined1 local_198 [8];
  digit_grouping<char16_t> grouping_1;
  undefined1 auStack_168 [4];
  int num_zeros_3;
  char **local_160;
  sign_t *local_158;
  basic_format_specs<char16_t> *local_150;
  digit_grouping<char16_t> *local_148;
  locale_ref *local_140;
  char16_t *local_138;
  char16_t *local_130;
  char16_t *local_128;
  float_specs local_120;
  big_decimal_fp *local_108;
  undefined1 local_100 [8];
  digit_grouping<char16_t> grouping;
  int num_zeros_2;
  int exp;
  undefined1 local_b0 [8];
  anon_class_40_8_70a3e612 write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  int output_exp;
  char16_t local_5a;
  size_t sStack_58;
  char16_t decimal_point;
  size_t size;
  char16_t local_46;
  sign_t sign;
  char16_t zero;
  char *pcStack_40;
  int significand_size;
  char *significand;
  basic_format_specs<char16_t> *specs_local;
  big_decimal_fp *fp_local;
  locale_ref loc_local;
  float_specs fspecs_local;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out_local;
  
  pcStack_40 = fp->significand;
  significand = (char *)specs;
  specs_local = (basic_format_specs<char16_t> *)fp;
  fp_local = (big_decimal_fp *)loc.locale_;
  loc_local.locale_ = (void *)fspecs;
  fspecs_local = (float_specs)out.container;
  sign = get_significand_size(fp);
  local_46 = L'0';
  size._4_4_ = loc_local.locale_._4_4_ >> 8 & 0xff;
  tVar3 = to_unsigned<int>(sign);
  sStack_58 = (size_t)(tVar3 + (size._4_4_ != none));
  if ((loc_local.locale_._4_4_ >> 0x11 & 1) == 0) {
    local_232 = L'.';
  }
  else {
    stack0xffffffffffffff98 = fp_local;
    local_232 = decimal_point<char16_t>((locale_ref)fp_local);
  }
  local_5a = local_232;
  use_exp_format.fspecs.precision = *(int *)(specs_local->fill).data_ + sign + -1;
  _abs_output_exp = (float_specs)loc_local.locale_;
  use_exp_format.fspecs._4_4_ = use_exp_format.fspecs.precision;
  bVar2 = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_fmt::v8::detail::big_decimal_fp,_char16_t,_fmt::v8::detail::digit_grouping<char16_t>_>
          ::anon_class_12_2_f0c9b3c6::operator()((anon_class_12_2_f0c9b3c6 *)&abs_output_exp);
  if (bVar2) {
    exp_digits = 0;
    if ((loc_local.locale_._4_4_ >> 0x14 & 1) == 0) {
      if (sign == minus) {
        local_5a = L'\0';
      }
    }
    else {
      exp_digits = (int)loc_local.locale_ - sign;
      if (exp_digits < 0) {
        exp_digits = 0;
      }
      tVar3 = to_unsigned<int>(exp_digits);
      sStack_58 = tVar3 + sStack_58;
    }
    if ((int)use_exp_format.fspecs._4_4_ < 0) {
      local_238 = -use_exp_format.fspecs._4_4_;
    }
    else {
      local_238 = use_exp_format.fspecs._4_4_;
    }
    write._36_4_ = 2;
    if ((99 < local_238) && (write._36_4_ = 3, 999 < local_238)) {
      write._36_4_ = 4;
    }
    tVar3 = to_unsigned<int>((local_5a != L'\0') + 2 + write._36_4_);
    fVar1 = fspecs_local;
    sStack_58 = tVar3 + sStack_58;
    local_239 = 0x45;
    if (((ulong)loc_local.locale_ & 0x1000000000000) == 0) {
      local_239 = 0x65;
    }
    write.output_exp._3_1_ = local_239;
    local_b0._0_4_ = size._4_4_;
    write._0_8_ = pcStack_40;
    write.significand._0_4_ = sign;
    write.significand._4_2_ = local_5a;
    write.significand_size = exp_digits;
    write.decimal_point = L'0';
    write._22_1_ = local_239;
    write.num_zeros = use_exp_format.fspecs._4_4_;
    if (*(int *)significand < 1) {
      pbVar5 = reserve<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                         ((back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> *)&fspecs_local,
                          sStack_58);
      it = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_fmt::v8::detail::big_decimal_fp,_char16_t,_fmt::v8::detail::digit_grouping<char16_t>_>
           ::anon_class_40_8_70a3e612::operator()
                     ((anon_class_40_8_70a3e612 *)local_b0,pbVar5->container);
      out_local = base_iterator<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                            ((back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)fVar1,it);
    }
    else {
      out_local = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                            ((back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)fspecs_local,
                             (basic_format_specs<char16_t> *)significand,sStack_58,
                             (anon_class_40_8_70a3e612 *)local_b0);
    }
  }
  else {
    grouping.sep_._36_4_ = *(int *)(specs_local->fill).data_ + sign;
    if (*(int *)(specs_local->fill).data_ < 0) {
      if ((int)grouping.sep_._36_4_ < 1) {
        local_1ec = -grouping.sep_._36_4_;
        if (((sign == none) && (-1 < (int)loc_local.locale_)) &&
           ((int)loc_local.locale_ < local_1ec)) {
          local_1ec = (int)loc_local.locale_;
        }
        local_281 = true;
        if ((local_1ec == 0) && (local_281 = true, sign == none)) {
          local_281 = (bool)((byte)(loc_local.locale_._4_4_ >> 0x14) & 1);
        }
        local_1ed = local_281;
        tVar3 = to_unsigned<int>(local_1ec);
        sStack_58 = ((local_281 != false) + 1 + tVar3) + sStack_58;
        local_1f8 = fspecs_local;
        local_230.sign = (sign_t *)((long)&size + 4);
        local_230.zero = &local_46;
        local_230.pointy = &local_1ed;
        local_230.decimal_point = &local_5a;
        local_230.num_zeros = &local_1ec;
        local_230.significand = &stack0xffffffffffffffc0;
        local_230.significand_size = (int *)&sign;
        out_local = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_4_>
                              ((back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)
                               fspecs_local,(basic_format_specs<char16_t> *)significand,sStack_58,
                               &local_230);
      }
      else {
        if ((loc_local.locale_._4_4_ >> 0x14 & 1) == 0) {
          local_25c = 0;
        }
        else {
          local_25c = (int)loc_local.locale_ - sign;
        }
        grouping_1.sep_._36_4_ = local_25c;
        if (local_25c < 1) {
          local_260 = 0;
        }
        else {
          local_260 = local_25c;
        }
        tVar3 = to_unsigned<int>(local_260);
        sStack_58 = sStack_58 + (tVar3 + 1);
        local_1a0 = fp_local;
        digit_grouping<char16_t>::digit_grouping
                  ((digit_grouping<char16_t> *)local_198,(locale_ref)fp_local,
                   (bool)((byte)(loc_local.locale_._4_4_ >> 0x11) & 1));
        iVar4 = digit_grouping<char16_t>::count_separators
                          ((digit_grouping<char16_t> *)local_198,sign);
        tVar3 = to_unsigned<int>(iVar4);
        sStack_58 = sStack_58 + tVar3;
        local_1a8 = fspecs_local;
        _auStack_1e8 = (sign_t *)((long)&size + 4);
        local_1e0 = &stack0xffffffffffffffc0;
        local_1d8 = &sign;
        local_1d0 = (int *)&grouping.sep_.field_0x24;
        local_1c8 = &local_5a;
        local_1c0 = (digit_grouping<char16_t> *)local_198;
        local_1b8 = (int *)&grouping_1.sep_.field_0x24;
        local_1b0 = &local_46;
        out_local = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_3_>
                              ((back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)
                               fspecs_local,(basic_format_specs<char16_t> *)significand,sStack_58,
                               (anon_class_64_8_e6ffa566 *)auStack_1e8);
        digit_grouping<char16_t>::~digit_grouping((digit_grouping<char16_t> *)local_198);
      }
    }
    else {
      tVar3 = to_unsigned<int>(*(int *)(specs_local->fill).data_);
      sStack_58 = tVar3 + sStack_58;
      grouping.sep_._32_4_ = (int)loc_local.locale_ - grouping.sep_._36_4_;
      if ((loc_local.locale_._4_4_ >> 0x14 & 1) != 0) {
        if (((int)grouping.sep_._32_4_ < 1) && ((char)((ulong)loc_local.locale_ >> 0x20) != '\x02'))
        {
          grouping.sep_.thousands_sep = L'\x01';
          grouping.sep_._34_2_ = 0;
        }
        if (0 < (int)grouping.sep_._32_4_) {
          tVar3 = to_unsigned<int>(grouping.sep_._32_4_);
          sStack_58 = (tVar3 + 1) + sStack_58;
        }
      }
      local_108 = fp_local;
      digit_grouping<char16_t>::digit_grouping
                ((digit_grouping<char16_t> *)local_100,(locale_ref)fp_local,
                 (bool)((byte)(loc_local.locale_._4_4_ >> 0x11) & 1));
      iVar4 = digit_grouping<char16_t>::count_separators((digit_grouping<char16_t> *)local_100,sign)
      ;
      tVar3 = to_unsigned<int>(iVar4);
      sStack_58 = sStack_58 + tVar3;
      local_120 = fspecs_local;
      _auStack_168 = (sign_t *)((long)&size + 4);
      local_160 = &stack0xffffffffffffffc0;
      local_158 = &sign;
      local_150 = specs_local;
      local_148 = (digit_grouping<char16_t> *)local_100;
      local_140 = &loc_local;
      local_138 = &local_5a;
      local_130 = &grouping.sep_.thousands_sep;
      local_128 = &local_46;
      out_local = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_2_>
                            ((back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)fspecs_local,
                             (basic_format_specs<char16_t> *)significand,sStack_58,
                             (anon_class_72_9_d68ba176 *)auStack_168);
      digit_grouping<char16_t>::~digit_grouping((digit_grouping<char16_t> *)local_100);
    }
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)out_local.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}